

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O0

bool __thiscall
google::protobuf::io::ConcatenatingInputStream::Skip(ConcatenatingInputStream *this,int count)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  int in_ESI;
  long in_RDI;
  int64 final_byte_count;
  int64 target_byte_count;
  int local_14;
  
  local_14 = in_ESI;
  while( true ) {
    if (*(int *)(in_RDI + 0x10) < 1) {
      return false;
    }
    iVar1 = (**(code **)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x28))();
    uVar2 = (**(code **)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x20))
                      ((long *)**(undefined8 **)(in_RDI + 8),local_14);
    if ((uVar2 & 1) != 0) break;
    lVar3 = (**(code **)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x28))();
    local_14 = (iVar1 + local_14) - (int)lVar3;
    *(long *)(in_RDI + 0x18) = lVar3 + *(long *)(in_RDI + 0x18);
    *(long *)(in_RDI + 8) = *(long *)(in_RDI + 8) + 8;
    *(int *)(in_RDI + 0x10) = *(int *)(in_RDI + 0x10) + -1;
  }
  return true;
}

Assistant:

bool ConcatenatingInputStream::Skip(int count) {
  while (stream_count_ > 0) {
    // Assume that ByteCount() can be used to find out how much we actually
    // skipped when Skip() fails.
    int64 target_byte_count = streams_[0]->ByteCount() + count;
    if (streams_[0]->Skip(count)) return true;

    // Hit the end of the stream.  Figure out how many more bytes we still have
    // to skip.
    int64 final_byte_count = streams_[0]->ByteCount();
    GOOGLE_DCHECK_LT(final_byte_count, target_byte_count);
    count = target_byte_count - final_byte_count;

    // That stream is done.  Advance to the next one.
    bytes_retired_ += final_byte_count;
    ++streams_;
    --stream_count_;
  }

  return false;
}